

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O1

TValue * luaH_getshortstr(Table *t,TString *key)

{
  Node *in_RAX;
  TValue *pTVar1;
  Node *pNVar2;
  long lVar3;
  bool bVar4;
  
  pNVar2 = t->node + (~(-1 << (t->lsizenode & 0x1f)) & key->hash);
  do {
    pTVar1 = &pNVar2->i_val;
    if (((((Node *)pTVar1)->i_key).nk.tt_ == 0x44) &&
       ((TString *)(((Node *)pTVar1)->i_key).nk.value_.gc == key)) {
      bVar4 = false;
      pNVar2 = (Node *)pTVar1;
    }
    else {
      lVar3 = (long)(((Node *)pTVar1)->i_key).nk.next;
      pNVar2 = (Node *)((long)pTVar1 + lVar3 * 0x20);
      bVar4 = lVar3 != 0;
      pTVar1 = &in_RAX->i_val;
      if (!bVar4) {
        pTVar1 = &luaO_nilobject_;
      }
    }
    in_RAX = (Node *)pTVar1;
  } while (bVar4);
  return pTVar1;
}

Assistant:

const TValue *luaH_getshortstr (Table *t, TString *key) {
  Node *n = hashstr(t, key);
  lua_assert(key->tt == LUA_TSHRSTR);
  for (;;) {  /* check whether 'key' is somewhere in the chain */
    const TValue *k = gkey(n);
    if (ttisshrstring(k) && eqshrstr(tsvalue(k), key))
      return gval(n);  /* that's it */
    else {
      int nx = gnext(n);
      if (nx == 0)
        return luaO_nilobject;  /* not found */
      n += nx;
    }
  }
}